

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

void __thiscall
icu_63::DateTimePatternGenerator::AppendItemNamesSink::fillInMissing(AppendItemNamesSink *this)

{
  DateTimePatternGenerator *pDVar1;
  long lVar2;
  int32_t length;
  long lVar3;
  long lVar4;
  int32_t i;
  ulong uVar5;
  UnicodeString *this_00;
  UnicodeString local_70;
  
  lVar4 = 0x508;
  uVar5 = 0;
  do {
    pDVar1 = this->dtpg;
    lVar2 = uVar5 * 0xc0;
    if (*(ushort *)(&pDVar1->field_0x510 + lVar2) < 0x20) {
      this_00 = (UnicodeString *)(&pDVar1->field_0x508 + lVar2);
      local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x46;
      if (*(short *)(&pDVar1->field_0x510 + lVar2) < 0) {
        length = *(int32_t *)(&pDVar1->field_0x514 + lVar2);
      }
      else {
        length = (int)*(short *)(&pDVar1->field_0x510 + lVar2) >> 5;
      }
      icu_63::UnicodeString::doReplace(this_00,0,length,(UChar *)&local_70,0,1);
      if (uVar5 < 10) {
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = (ushort)uVar5 | 0x30;
      }
      else {
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x31;
        icu_63::UnicodeString::doAppend(this_00,(UChar *)&local_70,0,1);
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = (ushort)uVar5 + 0x26;
      }
      icu_63::UnicodeString::doAppend(this_00,(UChar *)&local_70,0,1);
      icu_63::UnicodeString::getTerminatedBuffer(this_00);
    }
    lVar3 = 2;
    lVar2 = lVar4;
    do {
      pDVar1 = this->dtpg;
      if (*(ushort *)((pDVar1->pLocale).fullNameBuffer + lVar2 + 0x10) < 0x20) {
        icu_63::UnicodeString::UnicodeString
                  (&local_70,(UnicodeString *)((pDVar1->pLocale).language + lVar2 + -0x10));
        icu_63::UnicodeString::moveFrom
                  ((UnicodeString *)((pDVar1->pLocale).fullNameBuffer + lVar2 + 8),&local_70);
        icu_63::UnicodeString::~UnicodeString(&local_70);
      }
      lVar2 = lVar2 + 0x40;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0xc0;
  } while (uVar5 != 0x10);
  return;
}

Assistant:

void fillInMissing() {
        for (int32_t i = 0; i < UDATPG_FIELD_COUNT; i++) {
            UnicodeString& valueStr = dtpg.getMutableFieldDisplayName((UDateTimePatternField)i, UDATPG_WIDE);
            if (valueStr.isEmpty()) {
                valueStr = CAP_F;
                U_ASSERT(i < 20);
                if (i < 10) {
                    // F0, F1, ..., F9
                    valueStr += (UChar)(i+0x30);
                } else {
                    // F10, F11, ...
                    valueStr += (UChar)0x31;
                    valueStr += (UChar)(i-10 + 0x30);
                }
                // NUL-terminate for the C API.
                valueStr.getTerminatedBuffer();
            }
            for (int32_t j = 1; j < UDATPG_WIDTH_COUNT; j++) {
                UnicodeString& valueStr2 = dtpg.getMutableFieldDisplayName((UDateTimePatternField)i, (UDateTimePGDisplayWidth)j);
                if (valueStr2.isEmpty()) {
                    valueStr2 = dtpg.getFieldDisplayName((UDateTimePatternField)i, (UDateTimePGDisplayWidth)(j-1));
                }
            }
        }
    }